

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ModportPortSymbol::serializeTo(ModportPortSymbol *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar1;
  Symbol *in_stack_00000088;
  ASTSerializer *in_stack_00000090;
  undefined1 in_stack_00000098 [16];
  ASTSerializer *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 local_30;
  undefined4 local_20;
  undefined8 local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff98);
  sVar1 = ast::toString(In);
  local_30 = sVar1._M_len;
  ASTSerializer::write(this_00,local_20,local_18,local_30);
  if (*(long *)(in_RDI + 0x158) != 0) {
    in_stack_ffffffffffffff98 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    ASTSerializer::writeLink(in_stack_00000090,(string_view)in_stack_00000098,in_stack_00000088);
  }
  if (*(long *)(in_RDI + 0x160) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff98);
    ASTSerializer::write(in_RSI,local_50,local_48,*(size_t *)(in_RDI + 0x160));
  }
  return;
}

Assistant:

void ModportPortSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("direction", toString(direction));
    if (internalSymbol)
        serializer.writeLink("internalSymbol", *internalSymbol);
    if (explicitConnection)
        serializer.write("explicitConnection", *explicitConnection);
}